

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

char * Abc_SopEncoderLog(Mem_Flex_t *pMan,int iBit,int nValues)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Vec_Str_t *p;
  char *pcVar6;
  char *pcVar7;
  int i;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  
  iVar4 = nValues;
  if (1 < (uint)nValues) {
    uVar3 = nValues - 1;
    if (uVar3 == 0) {
      iVar4 = 0;
    }
    else {
      uVar5 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      iVar4 = (uVar5 ^ 0xffffffe0) + 0x21;
    }
  }
  if (iVar4 <= iBit) {
    __assert_fail("iBit < nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                  ,0x449,"char *Abc_SopEncoderLog(Mem_Flex_t *, int, int)");
  }
  uVar3 = 0;
  if (0 < nValues) {
    uVar5 = 0;
    do {
      uVar5 = uVar5 + ((uVar3 >> (iBit & 0x1fU) & 1) != 0);
      uVar3 = uVar3 + 1;
    } while (nValues != uVar3);
    uVar3 = (uint)(1 < uVar5);
  }
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  pcVar6 = (char *)malloc(100);
  p->pArray = pcVar6;
  uVar5 = 100;
  uVar8 = 0;
  do {
    cVar1 = "d0\n"[uVar8];
    if (uVar8 == uVar5) {
      if ((int)uVar5 < 0x10) {
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,0x10);
        }
        uVar5 = 0x10;
      }
      else {
        uVar10 = uVar5 * 2;
        if (SBORROW4(uVar5,uVar10) != 0 < (int)uVar5) {
          uVar5 = uVar10;
          if (pcVar6 == (char *)0x0) {
            pcVar6 = (char *)malloc((ulong)uVar10);
          }
          else {
            pcVar6 = (char *)realloc(pcVar6,(ulong)uVar10);
          }
        }
      }
    }
    pcVar6[uVar8] = cVar1;
    uVar8 = uVar8 + 1;
  } while (uVar8 != 3);
  p->nSize = 3;
  p->nCap = uVar5;
  p->pArray = pcVar6;
  if ((char)uVar3 != '\0') {
    uVar5 = p->nSize;
    uVar10 = p->nCap;
    pcVar6 = p->pArray;
    if (uVar5 == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,0x10);
        }
        sVar11 = 0x10;
      }
      else {
        sVar11 = (ulong)uVar10 * 2;
        if ((int)sVar11 <= (int)uVar10) goto LAB_00869486;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(sVar11);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,sVar11);
        }
      }
    }
    else {
LAB_00869486:
      sVar11 = (size_t)uVar10;
    }
    pcVar6[(int)uVar5] = '(';
    p->nSize = uVar5 + 1;
    p->nCap = (int)sVar11;
    p->pArray = pcVar6;
  }
  if (0 < nValues) {
    bVar2 = true;
    uVar5 = 0;
    do {
      if ((uVar5 & 1 << ((byte)iBit & 0x1f)) != 0) {
        if (!bVar2) {
          uVar10 = p->nSize;
          uVar9 = p->nCap;
          if (uVar10 == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(p->pArray,0x10);
              }
              sVar11 = 0x10;
            }
            else {
              sVar11 = (ulong)uVar9 * 2;
              if ((int)sVar11 <= (int)uVar9) goto LAB_0086954c;
              if (p->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar11);
              }
              else {
                pcVar6 = (char *)realloc(p->pArray,sVar11);
              }
            }
            p->pArray = pcVar6;
            p->nCap = (int)sVar11;
          }
LAB_0086954c:
          p->nSize = uVar10 + 1;
          p->pArray[(int)uVar10] = ',';
        }
        Vec_StrPrintNum(p,uVar5);
        bVar2 = false;
      }
      uVar5 = uVar5 + 1;
    } while (nValues != uVar5);
  }
  if ((char)uVar3 != '\0') {
    uVar3 = p->nSize;
    uVar5 = p->nCap;
    pcVar6 = p->pArray;
    if (uVar3 == uVar5) {
      if ((int)uVar5 < 0x10) {
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,0x10);
        }
        sVar11 = 0x10;
      }
      else {
        sVar11 = (ulong)uVar5 * 2;
        if ((int)sVar11 <= (int)uVar5) goto LAB_008695d3;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(sVar11);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,sVar11);
        }
      }
    }
    else {
LAB_008695d3:
      sVar11 = (size_t)uVar5;
    }
    pcVar6[(int)uVar3] = ')';
    p->nSize = uVar3 + 1;
    p->nCap = (int)sVar11;
    p->pArray = pcVar6;
  }
  uVar3 = p->nCap;
  uVar5 = p->nSize;
  pcVar6 = p->pArray;
  lVar12 = (long)(int)uVar5 << 0x20;
  lVar13 = 0;
  uVar10 = uVar5;
  do {
    uVar9 = uVar10;
    cVar1 = ".names n%0*d\n 1\n"[lVar13 + 0xd];
    if (uVar9 == uVar3) {
      if ((int)uVar3 < 0x10) {
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)malloc(0x10);
        }
        else {
          pcVar6 = (char *)realloc(pcVar6,0x10);
        }
        uVar3 = 0x10;
      }
      else {
        uVar10 = uVar3 * 2;
        if (SBORROW4(uVar3,uVar10) != 0 < (int)uVar3) {
          uVar3 = uVar10;
          if (pcVar6 == (char *)0x0) {
            pcVar6 = (char *)malloc((ulong)uVar10);
          }
          else {
            pcVar6 = (char *)realloc(pcVar6,(ulong)uVar10);
          }
        }
      }
    }
    pcVar6[lVar13 + (int)uVar5] = cVar1;
    lVar13 = lVar13 + 1;
    uVar10 = uVar9 + 1;
    lVar12 = lVar12 + 0x100000000;
  } while (lVar13 != 3);
  p->nSize = uVar10;
  p->nCap = uVar3;
  p->pArray = pcVar6;
  if (uVar10 == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (p->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(p->pArray,0x10);
      }
      uVar5 = 0x10;
    }
    else {
      uVar5 = uVar3 * 2;
      if (SBORROW4(uVar3,uVar5) == 0 < (int)uVar3) goto LAB_00869727;
      if (p->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc((ulong)uVar5);
      }
      else {
        pcVar6 = (char *)realloc(p->pArray,(ulong)uVar5);
      }
    }
    p->pArray = pcVar6;
    p->nCap = uVar5;
  }
LAB_00869727:
  pcVar6 = p->pArray;
  p->nSize = uVar9 + 2;
  pcVar6[lVar12 >> 0x20] = '\0';
  pcVar7 = Abc_SopRegister(pMan,pcVar6);
  if (pcVar6 != (char *)0x0) {
    free(pcVar6);
    p->pArray = (char *)0x0;
  }
  free(p);
  return pcVar7;
}

Assistant:

char * Abc_SopEncoderLog( Mem_Flex_t * pMan, int iBit, int nValues )
{
    char * pResult;
    Vec_Str_t * vSop;
    int v, Counter, fFirst = 1, nBits = Abc_Base2Log(nValues);
    assert( iBit < nBits );
    // count the number of literals
    Counter = 0;
    for ( v = 0; v < nValues; v++ )
        Counter += ( (v & (1 << iBit)) > 0 );
    // create the cover
    vSop = Vec_StrAlloc( 100 );
    Vec_StrPrintStr( vSop, "d0\n" );
    if ( Counter > 1 )
        Vec_StrPrintStr( vSop, "(" );
    for ( v = 0; v < nValues; v++ )
        if ( v & (1 << iBit) )
        {
            if ( fFirst )
                fFirst = 0;
            else
                Vec_StrPush( vSop, ',' );
            Vec_StrPrintNum( vSop, v );
        }
    if ( Counter > 1 )
        Vec_StrPrintStr( vSop, ")" );
    Vec_StrPrintStr( vSop, " 1\n" );
    Vec_StrPush( vSop, 0 );
    pResult = Abc_SopRegister( pMan, Vec_StrArray(vSop) );
    Vec_StrFree( vSop );
    return pResult;
}